

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v1.cpp
# Opt level: O1

void __thiscall
LASreadItemCompressed_POINT10_v1::~LASreadItemCompressed_POINT10_v1
          (LASreadItemCompressed_POINT10_v1 *this)

{
  IntegerCompressor *pIVar1;
  long lVar2;
  
  (this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem =
       (_func_int **)&PTR_read_0015e590;
  pIVar1 = this->ic_dx;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
    operator_delete(pIVar1);
  }
  pIVar1 = this->ic_dy;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
    operator_delete(pIVar1);
  }
  pIVar1 = this->ic_z;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
    operator_delete(pIVar1);
  }
  pIVar1 = this->ic_intensity;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
    operator_delete(pIVar1);
  }
  pIVar1 = this->ic_scan_angle_rank;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
    operator_delete(pIVar1);
  }
  pIVar1 = this->ic_point_source_ID;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
    operator_delete(pIVar1);
  }
  ArithmeticDecoder::destroySymbolModel(this->dec,this->m_changed_values);
  lVar2 = -0x100;
  do {
    if (this->m_classification[lVar2] != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::destroySymbolModel(this->dec,this->m_classification[lVar2]);
    }
    if (this->m_user_data[lVar2] != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::destroySymbolModel(this->dec,this->m_user_data[lVar2]);
    }
    if (*(ArithmeticModel **)(this[1].last_item + lVar2 * 8 + -0x10) != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::destroySymbolModel
                (this->dec,*(ArithmeticModel **)(this[1].last_item + lVar2 * 8 + -0x10));
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  return;
}

Assistant:

LASreadItemCompressed_POINT10_v1::~LASreadItemCompressed_POINT10_v1()
{
  U32 i;

  delete ic_dx;
  delete ic_dy;
  delete ic_z;
  delete ic_intensity;
  delete ic_scan_angle_rank;
  delete ic_point_source_ID;
  dec->destroySymbolModel(m_changed_values);
  for (i = 0; i < 256; i++)
  {
    if (m_bit_byte[i]) dec->destroySymbolModel(m_bit_byte[i]);
    if (m_classification[i]) dec->destroySymbolModel(m_classification[i]);
    if (m_user_data[i]) dec->destroySymbolModel(m_user_data[i]);
  }
}